

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool Items_SingleStringGetter(void *data,int idx,char **out_text)

{
  size_t sVar1;
  char *local_40;
  char *p;
  int items_count;
  char *items_separated_by_zeros;
  char **out_text_local;
  int idx_local;
  void *data_local;
  
  local_40 = (char *)data;
  for (p._4_4_ = 0; (*local_40 != '\0' && (idx != p._4_4_)); p._4_4_ = p._4_4_ + 1) {
    sVar1 = strlen(local_40);
    local_40 = local_40 + sVar1 + 1;
  }
  if (*local_40 == '\0') {
    data_local._7_1_ = false;
  }
  else {
    if (out_text != (char **)0x0) {
      *out_text = local_40;
    }
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

static bool Items_SingleStringGetter(void* data, int idx, const char** out_text)
{
    // FIXME-OPT: we could pre-compute the indices to fasten this. But only 1 active combo means the waste is limited.
    const char* items_separated_by_zeros = (const char*)data;
    int items_count = 0;
    const char* p = items_separated_by_zeros;
    while (*p)
    {
        if (idx == items_count)
            break;
        p += strlen(p) + 1;
        items_count++;
    }
    if (!*p)
        return false;
    if (out_text)
        *out_text = p;
    return true;
}